

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boing.c
# Opt level: O1

void CrossProduct(vertex_t a,vertex_t b,vertex_t c,vertex_t *n)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar1 = b.x - a.x;
  fVar2 = c.x - a.x;
  fVar3 = c.y - a.y;
  fVar5 = b.y - a.y;
  fVar4 = c.z - a.z;
  n->x = fVar5 * fVar4 - fVar4 * fVar3;
  n->y = (b.y - a.z) * fVar2 - fVar4 * fVar1;
  n->z = fVar3 * fVar1 - fVar5 * fVar2;
  return;
}

Assistant:

void CrossProduct( vertex_t a, vertex_t b, vertex_t c, vertex_t *n )
{
   GLfloat u1, u2, u3;
   GLfloat v1, v2, v3;

   u1 = b.x - a.x;
   u2 = b.y - a.y;
   u3 = b.y - a.z;

   v1 = c.x - a.x;
   v2 = c.y - a.y;
   v3 = c.z - a.z;

   n->x = u2 * v3 - v2 * v3;
   n->y = u3 * v1 - v3 * u1;
   n->z = u1 * v2 - v1 * u2;
}